

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall Assimp::IFC::Schema_2x3::IfcSlab::IfcSlab(IfcSlab *this)

{
  IfcSlab *this_local;
  
  STEP::Object::Object((Object *)&this->field_0x180,"IfcSlab");
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__010fa810);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>::ObjectHelper
            (&this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>,
             &PTR_construction_vtable_24__010fa948);
  *(undefined8 *)this = 0x10fa6e0;
  *(undefined8 *)&this->field_0x180 = 0x10fa7f8;
  *(undefined8 *)&this->field_0x88 = 0x10fa708;
  *(undefined8 *)&this->field_0x98 = 0x10fa730;
  *(undefined8 *)&this->field_0xd0 = 0x10fa758;
  *(undefined8 *)&this->field_0x100 = 0x10fa780;
  *(undefined8 *)&this->field_0x138 = 0x10fa7a8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x10fa7d0;
  STEP::Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Maybe((Maybe<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *)
        &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSlab,_1UL>).field_0x10);
  return;
}

Assistant:

IfcSlab() : Object("IfcSlab") {}